

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O2

RealType __thiscall OpenMD::NVT::calcConservedQuantity(NVT *this)

{
  int iVar1;
  double dVar2;
  RealType RVar3;
  undefined1 auVar4 [16];
  pair<double,_double> pVar5;
  
  pVar5 = Snapshot::getThermostat((this->super_VelocityVerletIntegrator).super_Integrator.snap);
  iVar1 = SimInfo::getNdf((this->super_VelocityVerletIntegrator).super_Integrator.info_);
  dVar2 = (double)iVar1 * 8.31451e-07 * this->targetTemp_;
  RVar3 = Thermo::getTotalEnergy(&(this->super_VelocityVerletIntegrator).super_Integrator.thermo);
  auVar4._0_8_ = dVar2 * pVar5.second;
  auVar4._8_8_ = dVar2 * this->tauThermostat_ * this->tauThermostat_ * pVar5.first * pVar5.first;
  auVar4 = divpd(auVar4,_DAT_0024c6e0);
  return RVar3 + auVar4._8_8_ + auVar4._0_8_;
}

Assistant:

RealType NVT::calcConservedQuantity() {
    pair<RealType, RealType> thermostat = snap->getThermostat();
    RealType conservedQuantity;
    RealType fkBT;
    RealType Energy;
    RealType thermostat_kinetic;
    RealType thermostat_potential;

    fkBT = info_->getNdf() * Constants::kB * targetTemp_;

    Energy = thermo.getTotalEnergy();

    thermostat_kinetic = fkBT * tauThermostat_ * tauThermostat_ *
                         thermostat.first * thermostat.first /
                         (2.0 * Constants::energyConvert);

    thermostat_potential = fkBT * thermostat.second / Constants::energyConvert;

    conservedQuantity = Energy + thermostat_kinetic + thermostat_potential;

    return conservedQuantity;
  }